

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O3

pair<slang::parsing::Trivia,_slang::parsing::Trivia> * __thiscall
slang::parsing::Preprocessor::handlePragmaDirective
          (pair<slang::parsing::Trivia,_slang::parsing::Trivia> *__return_storage_ptr__,
          Preprocessor *this,Token directive)

{
  Token *pTVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined1 uVar6;
  undefined1 uVar9;
  Info *pIVar5;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  BumpAllocator *this_00;
  Token directive_00;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  undefined1 auVar18 [16];
  undefined8 uVar19;
  pair<slang::parsing::Trivia,_slang::parsing::Trivia> *ppVar20;
  bool bVar21;
  int iVar23;
  bool bVar22;
  SourceLocation SVar24;
  undefined4 extraout_var;
  PragmaDirectiveSyntax *pragma;
  undefined4 extraout_var_00;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  Info *extraout_RDX_01;
  EVP_PKEY_CTX *src_00;
  __extent_storage<18446744073709551615UL> extraout_RDX_02;
  Token TVar25;
  string_view sVar26;
  Trivia TVar27;
  pair<slang::syntax::PragmaExpressionSyntax_*,_bool> pVar28;
  Token TVar29;
  span<const_slang::parsing::Token,_18446744073709551615UL> tokens;
  Trivia skippedTrivia;
  Token name;
  SmallVector<slang::parsing::Token,_4UL> skipped;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> args;
  undefined1 local_158 [16];
  __index_type local_148;
  Token local_140;
  pair<slang::parsing::Trivia,_slang::parsing::Trivia> *local_130;
  Token *local_128;
  Token local_120;
  Token local_110;
  SmallVectorBase<slang::parsing::Token> local_100 [2];
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_a8 [2];
  
  local_120.info = directive.info;
  local_120._0_8_ = directive._0_8_;
  pTVar1 = &this->currentToken;
  pIVar5 = (this->currentToken).info;
  if (pIVar5 == (Info *)0x0) {
    TVar25 = nextProcessed(this);
    this->currentToken = TVar25;
  }
  else {
    uVar2 = pTVar1->kind;
    uVar6 = pTVar1->field_0x2;
    uVar9 = pTVar1->numFlags;
    uVar12 = pTVar1->rawLen;
    TVar25.rawLen = uVar12;
    TVar25.numFlags.raw = uVar9;
    TVar25._2_1_ = uVar6;
    TVar25.kind = uVar2;
    TVar25.info = pIVar5;
  }
  if (TVar25.kind == Identifier) {
    if (TVar25.info == (Info *)0x0) {
      TVar25 = nextProcessed(this);
      this->currentToken = TVar25;
    }
    local_a8[0]._0_16_ = (undefined1  [16])TVar25;
    bVar21 = Token::isOnSameLine((Token *)local_a8);
    if (bVar21) {
      local_a8[0].len = 0;
      local_a8[0].data_ = (pointer)((long)local_a8 + 0x18);
      local_a8[0].cap = 4;
      local_100[0].data_ = (pointer)local_100[0].firstElement;
      local_100[0].len = 0;
      local_100[0].cap = 4;
      pIVar5 = (this->currentToken).info;
      local_130 = __return_storage_ptr__;
      if (pIVar5 == (Info *)0x0) {
        local_110 = nextProcessed(this);
        this->currentToken = local_110;
      }
      else {
        uVar3 = pTVar1->kind;
        uVar7 = pTVar1->field_0x2;
        uVar10 = pTVar1->numFlags;
        uVar13 = pTVar1->rawLen;
        local_110.rawLen = uVar13;
        local_110.numFlags.raw = uVar10;
        local_110._2_1_ = uVar7;
        local_110.kind = uVar3;
        local_110.info = pIVar5;
      }
      uVar15 = pTVar1->field_0x2;
      NVar16.raw = (pTVar1->numFlags).raw;
      uVar17 = pTVar1->rawLen;
      pIVar5 = (this->currentToken).info;
      (this->lastConsumed).kind = pTVar1->kind;
      (this->lastConsumed).field_0x2 = uVar15;
      (this->lastConsumed).numFlags = (NumericTokenFlags)NVar16.raw;
      (this->lastConsumed).rawLen = uVar17;
      (this->lastConsumed).info = pIVar5;
      Token::Token((Token *)local_158);
      auVar18 = local_158;
      local_128 = &this->lastConsumed;
      pTVar1->kind = local_158._0_2_;
      pTVar1->field_0x2 = local_158[2];
      pTVar1->numFlags = (NumericTokenFlags)local_158[3];
      pTVar1->rawLen = local_158._4_4_;
      (this->currentToken).info = (Info *)local_158._8_8_;
      bVar21 = false;
      local_158 = auVar18;
      do {
        bVar22 = peekSameLine(this);
        src = extraout_RDX;
        if (!bVar22) goto LAB_001fda09;
        if (bVar21) {
          local_158 = (undefined1  [16])expect(this,Comma);
          local_148 = '\0';
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (local_a8,(TokenOrSyntax *)local_158);
        }
        else {
          pVar28 = parsePragmaExpression(this);
          local_158._0_8_ = pVar28.first;
          local_148 = '\x01';
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (local_a8,(TokenOrSyntax *)local_158);
          if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            while (bVar21 = peekSameLine(this), src = extraout_RDX_00, bVar21) {
              pIVar5 = (this->currentToken).info;
              if (pIVar5 == (Info *)0x0) {
                TVar29 = nextProcessed(this);
                this->currentToken = TVar29;
              }
              else {
                uVar4 = pTVar1->kind;
                uVar8 = pTVar1->field_0x2;
                uVar11 = pTVar1->numFlags;
                uVar14 = pTVar1->rawLen;
                TVar29.rawLen = uVar14;
                TVar29.numFlags.raw = uVar11;
                TVar29._2_1_ = uVar8;
                TVar29.kind = uVar4;
                TVar29.info = pIVar5;
              }
              uVar15 = pTVar1->field_0x2;
              NVar16.raw = (pTVar1->numFlags).raw;
              uVar17 = pTVar1->rawLen;
              pIVar5 = (this->currentToken).info;
              local_128->kind = pTVar1->kind;
              local_128->field_0x2 = uVar15;
              local_128->numFlags = (NumericTokenFlags)NVar16.raw;
              local_128->rawLen = uVar17;
              local_128->info = pIVar5;
              Token::Token((Token *)local_158);
              auVar18 = local_158;
              pTVar1->kind = local_158._0_2_;
              pTVar1->field_0x2 = local_158[2];
              pTVar1->numFlags = (NumericTokenFlags)local_158[3];
              pTVar1->rawLen = local_158._4_4_;
              (this->currentToken).info = (Info *)local_158._8_8_;
              local_158 = auVar18;
              local_140 = TVar29;
              SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token>
                        (local_100,&local_140);
            }
LAB_001fda09:
            this_00 = this->alloc;
            local_158._0_4_ =
                 SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                           (local_a8,(EVP_PKEY_CTX *)this_00,src);
            local_158._4_4_ = extraout_var;
            local_158._8_8_ = extraout_RDX_01;
            pragma = BumpAllocator::
                     emplace<slang::syntax::PragmaDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&,std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>>
                               (this_00,&local_120,&local_110,
                                (span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)
                                local_158);
            ppVar20 = local_130;
            if (!bVar22) {
              applyPragma(this,pragma,local_100);
            }
            Trivia::Trivia((Trivia *)local_158);
            if (local_100[0].len != 0) {
              iVar23 = SmallVectorBase<slang::parsing::Token>::copy
                                 (local_100,(EVP_PKEY_CTX *)this->alloc,src_00);
              tokens._M_ptr._4_4_ = extraout_var_00;
              tokens._M_ptr._0_4_ = iVar23;
              tokens._M_extent._M_extent_value = extraout_RDX_02._M_extent_value;
              Trivia::Trivia((Trivia *)&local_140,SkippedTokens,tokens);
              TVar25 = local_140;
              uVar19 = local_140._0_8_;
              local_158._8_8_ = (undefined8)(CONCAT28(local_158._14_2_,local_140._6_8_) >> 0x10);
              local_140.kind = (TokenKind)uVar19;
              local_140._2_1_ = SUB81(uVar19,2);
              local_140.numFlags.raw = SUB81(uVar19,3);
              local_140.rawLen = SUB84(uVar19,4);
              local_158._0_2_ = local_140.kind;
              local_158[2] = local_140._2_1_;
              local_158[3] = local_140.numFlags.raw;
              local_158._4_4_ = local_140.rawLen;
              local_140 = TVar25;
            }
            Trivia::Trivia((Trivia *)&local_140,Directive,(SyntaxNode *)pragma);
            (ppVar20->first).field_0.rawText.ptr = (char *)local_140._0_8_;
            *(Info **)((long)&(ppVar20->first).field_0 + 8) = local_140.info;
            (ppVar20->second).field_0.rawText.ptr = (char *)local_158._0_8_;
            *(undefined8 *)((long)&(ppVar20->second).field_0 + 8) = local_158._8_8_;
            if (local_100[0].data_ != (pointer)local_100[0].firstElement) {
              operator_delete(local_100[0].data_);
            }
            if (local_a8[0].data_ == (pointer)((long)local_a8 + 0x18U)) {
              return ppVar20;
            }
            operator_delete(local_a8[0].data_);
            return ppVar20;
          }
        }
        bVar21 = (bool)(bVar21 ^ 1);
      } while( true );
    }
  }
  SVar24 = Token::location(&local_120);
  sVar26 = Token::rawText(&local_120);
  Diagnostics::add(this->diagnostics,(DiagCode)0x90004,
                   (SourceLocation)((long)SVar24 + sVar26._M_len * 0x10000000));
  directive_00.info = local_120.info;
  directive_00.kind = local_120.kind;
  directive_00._2_1_ = local_120._2_1_;
  directive_00.numFlags.raw = local_120.numFlags.raw;
  directive_00.rawLen = local_120.rawLen;
  TVar27 = createSimpleDirective(this,directive_00);
  Trivia::Trivia(&__return_storage_ptr__->second);
  (__return_storage_ptr__->first).field_0.rawText.ptr = TVar27.field_0._0_8_;
  (__return_storage_ptr__->first).hasFullLocation = (bool)(char)TVar27._12_2_;
  (__return_storage_ptr__->first).kind = (char)((ushort)TVar27._12_2_ >> 8);
  (__return_storage_ptr__->first).field_0.rawText.len = TVar27.field_0._8_4_;
  return __return_storage_ptr__;
}

Assistant:

std::pair<Trivia, Trivia> Preprocessor::handlePragmaDirective(Token directive) {
    if (peek().kind != TokenKind::Identifier || !peek().isOnSameLine()) {
        addDiag(diag::ExpectedPragmaName, directive.location() + directive.rawText().length());
        return {createSimpleDirective(directive), Trivia()};
    }

    SmallVector<TokenOrSyntax, 4> args;
    SmallVector<Token, 4> skipped;
    Token name = consume();
    bool wantComma = false;
    bool ok = true;

    // This loop needs to be careful not to prematurely peek() and pull a
    // new token from the lexer, since some pragmas may change how we lex
    // tokens on the following line (such as pragma protect encoded blocks).
    while (peekSameLine()) {
        if (wantComma) {
            args.push_back(expect(TokenKind::Comma));
            wantComma = false;
        }
        else {
            auto [expr, succeeded] = parsePragmaExpression();
            args.push_back(expr);
            wantComma = true;

            if (!succeeded) {
                while (peekSameLine())
                    skipped.push_back(consume());

                ok = false;
                break;
            }
        }
    }

    auto result = alloc.emplace<PragmaDirectiveSyntax>(directive, name, args.copy(alloc));
    if (ok)
        applyPragma(*result, skipped);

    Trivia skippedTrivia;
    if (!skipped.empty())
        skippedTrivia = Trivia(TriviaKind::SkippedTokens, skipped.copy(alloc));

    return {Trivia(TriviaKind::Directive, result), skippedTrivia};
}